

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

void __thiscall Board::print(Board *this)

{
  TileValue TVar1;
  ostream *poVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (this->SIZE != 0) {
    uVar4 = 0;
    do {
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      uVar7 = this->SIZE;
      if (uVar7 != 0) {
        uVar5 = 0;
        do {
          TVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7 * uVar4 + uVar5].value;
          cVar3 = (char)TVar1 + '0';
          if (TVar1 == Empty) {
            cVar3 = '-';
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
          local_50 = (long *)CONCAT71(local_50._1_7_,cVar3);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)&local_50,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          uVar6 = uVar5 + 1;
          if ((uVar6 % this->SQUARE_SIZE == 0) && (uVar5 != this->SIZE - 1)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
          }
          uVar7 = this->SIZE;
          uVar5 = uVar6;
        } while (uVar6 < uVar7);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      uVar7 = uVar4 + 1;
      if ((uVar7 % this->SQUARE_SIZE == 0) && (uVar4 != this->SIZE - 1)) {
        local_50 = local_40;
        std::__cxx11::string::_M_construct((ulong)&local_50,'&');
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_50,local_48);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      uVar4 = uVar7;
    } while (uVar7 < this->SIZE);
  }
  return;
}

Assistant:

void Board::print() const
{
	for (row r = 0; r < Board::SIZE; r++)
	{
		std::cout << std::endl;

		for (column c = 0; c < Board::SIZE; c++)
		{
			auto tile = _tiles[translate(c, r, Board::SIZE)];
			auto value = tile.value == TileValue::Empty ? '-' : static_cast<char>((int)tile.value + 48);

			std::cout << "  " << value << " ";

			if ((c + 1) % Board::SQUARE_SIZE == 0 && c != Board::SIZE - 1)
				std::cout << "|";
		}

		std::cout << std::endl;

		if ((r + 1) % Board::SQUARE_SIZE == 0 && r != Board::SIZE - 1)
		{
			std::cout << std::string(38, '_') << std::endl;
		}
	}

}